

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

void If_DsdManPrintDistrib(If_DsdMan_t *p)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  void **ppvVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int CountMarked [17];
  int CountStrNon [17];
  int CountStr [17];
  int CountObjNpn [17];
  int CountObjNon [17];
  int CountObj [17];
  uint local_208 [20];
  uint local_1b8 [20];
  uint local_168 [20];
  uint local_118 [20];
  uint local_c8 [38];
  
  local_c8[0x24] = 0;
  local_c8[0x20] = 0;
  local_c8[0x21] = 0;
  local_c8[0x22] = 0;
  local_c8[0x23] = 0;
  local_c8[0x1c] = 0;
  local_c8[0x1d] = 0;
  local_c8[0x1e] = 0;
  local_c8[0x1f] = 0;
  local_c8[0x18] = 0;
  local_c8[0x19] = 0;
  local_c8[0x1a] = 0;
  local_c8[0x1b] = 0;
  local_c8[0x14] = 0;
  local_c8[0x15] = 0;
  local_c8[0x16] = 0;
  local_c8[0x17] = 0;
  local_c8[0x10] = 0;
  local_c8[0xc] = 0;
  local_c8[0xd] = 0;
  local_c8[0xe] = 0;
  local_c8[0xf] = 0;
  local_c8[8] = 0;
  local_c8[9] = 0;
  local_c8[10] = 0;
  local_c8[0xb] = 0;
  local_c8[4] = 0;
  local_c8[5] = 0;
  local_c8[6] = 0;
  local_c8[7] = 0;
  local_c8[0] = 0;
  local_c8[1] = 0;
  local_c8[2] = 0;
  local_c8[3] = 0;
  local_118[0x10] = 0;
  local_118[0xc] = 0;
  local_118[0xd] = 0;
  local_118[0xe] = 0;
  local_118[0xf] = 0;
  local_118[8] = 0;
  local_118[9] = 0;
  local_118[10] = 0;
  local_118[0xb] = 0;
  local_118[4] = 0;
  local_118[5] = 0;
  local_118[6] = 0;
  local_118[7] = 0;
  local_118[0] = 0;
  local_118[1] = 0;
  local_118[2] = 0;
  local_118[3] = 0;
  local_168[0x10] = 0;
  local_168[0xc] = 0;
  local_168[0xd] = 0;
  local_168[0xe] = 0;
  local_168[0xf] = 0;
  local_168[8] = 0;
  local_168[9] = 0;
  local_168[10] = 0;
  local_168[0xb] = 0;
  local_168[4] = 0;
  local_168[5] = 0;
  local_168[6] = 0;
  local_168[7] = 0;
  local_168[0] = 0;
  local_168[1] = 0;
  local_168[2] = 0;
  local_168[3] = 0;
  local_1b8[0x10] = 0;
  local_1b8[0xc] = 0;
  local_1b8[0xd] = 0;
  local_1b8[0xe] = 0;
  local_1b8[0xf] = 0;
  local_1b8[8] = 0;
  local_1b8[9] = 0;
  local_1b8[10] = 0;
  local_1b8[0xb] = 0;
  local_1b8[4] = 0;
  local_1b8[5] = 0;
  local_1b8[6] = 0;
  local_1b8[7] = 0;
  local_1b8[0] = 0;
  local_1b8[1] = 0;
  local_1b8[2] = 0;
  local_1b8[3] = 0;
  local_208[0x10] = 0;
  local_208[0xc] = 0;
  local_208[0xd] = 0;
  local_208[0xe] = 0;
  local_208[0xf] = 0;
  local_208[8] = 0;
  local_208[9] = 0;
  local_208[10] = 0;
  local_208[0xb] = 0;
  local_208[4] = 0;
  local_208[5] = 0;
  local_208[6] = 0;
  local_208[7] = 0;
  local_208[0] = 0;
  local_208[1] = 0;
  local_208[2] = 0;
  local_208[3] = 0;
  uVar2 = p->nVars;
  if (2 < (int)uVar2) {
    lVar10 = 0;
    do {
      uVar3 = p->vTtMem[lVar10 + 3]->nEntries;
      local_118[lVar10 + 3] = uVar3;
      local_118[(ulong)uVar2 + 1] = local_118[(ulong)uVar2 + 1] + uVar3;
      lVar10 = lVar10 + 1;
    } while ((ulong)uVar2 - 2 != lVar10);
  }
  if (0 < (p->vObjs).nSize) {
    ppvVar7 = (p->vObjs).pArray;
    lVar10 = 0;
    do {
      pvVar4 = ppvVar7[lVar10];
      uVar2 = *(uint *)((long)pvVar4 + 4);
      local_c8[(ulong)(uVar2 >> 0x1b) + 0x14] = local_c8[(ulong)(uVar2 >> 0x1b) + 0x14] + 1;
      lVar9 = (long)p->nVars;
      local_c8[lVar9 + 0x15] = local_c8[lVar9 + 0x15] + 1;
      if ((uVar2 & 7) == 6) {
        local_c8[uVar2 >> 0x1b] = local_c8[uVar2 >> 0x1b] + 1;
        local_c8[lVar9 + 1] = local_c8[lVar9 + 1] + 1;
      }
      piVar1 = (int *)((long)local_168 + (ulong)(uVar2 >> 1 & 0x7c));
      *piVar1 = *piVar1 + 1;
      local_168[lVar9 + 1] = local_168[lVar9 + 1] + 1;
      iVar6 = If_DsdManCheckNonDec_rec(p,(int)lVar10);
      if (iVar6 != 0) {
        piVar1 = (int *)((long)local_1b8 + (ulong)(*(uint *)((long)pvVar4 + 4) >> 1 & 0x7c));
        *piVar1 = *piVar1 + 1;
        local_1b8[(long)p->nVars + 1] = local_1b8[(long)p->nVars + 1] + 1;
      }
      lVar9 = (long)(p->vObjs).nSize;
      if (lVar9 <= lVar10) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      ppvVar7 = (p->vObjs).pArray;
      if ((*(byte *)((long)ppvVar7[lVar10] + 5) & 1) != 0) {
        piVar1 = (int *)((long)local_208 + (ulong)(*(uint *)((long)pvVar4 + 4) >> 1 & 0x7c));
        *piVar1 = *piVar1 + 1;
        local_208[(long)p->nVars + 1] = local_208[(long)p->nVars + 1] + 1;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < lVar9);
  }
  puts("***** DSD MANAGER STATISTICS *****");
  printf("Support     ");
  printf("Obj   ");
  printf("ObjNDSD            ");
  printf("NPNNDSD                  ");
  printf("Str   ");
  printf("StrNDSD             ");
  printf("Marked  ");
  putchar(10);
  uVar8 = (ulong)(uint)p->nVars;
  if (-2 < p->nVars) {
    uVar11 = 0;
    do {
      if (uVar11 == (int)uVar8 + 1) {
        printf("All : ");
      }
      else {
        printf("%3d : ",uVar11 & 0xffffffff);
      }
      uVar2 = local_c8[uVar11 + 0x14];
      printf("%9d ",(ulong)uVar2);
      uVar3 = local_c8[uVar11];
      printf("%9d ",(ulong)uVar3);
      if ((int)uVar2 < 2) {
        uVar2 = 1;
      }
      printf("%6.2f %% ",SUB84(((double)(int)uVar3 * 100.0) / (double)(int)uVar2,0));
      uVar3 = local_118[uVar11];
      printf("%9d ",(ulong)uVar3);
      printf("%6.2f %% ",SUB84(((double)(int)uVar3 * 100.0) / (double)(int)uVar2,0));
      printf("  ");
      uVar2 = local_168[uVar11];
      printf("%9d ",(ulong)uVar2);
      uVar3 = local_1b8[uVar11];
      printf("%9d ",(ulong)uVar3);
      if ((int)uVar2 < 2) {
        uVar2 = 1;
      }
      printf("%6.2f %% ",SUB84(((double)(int)uVar3 * 100.0) / (double)(int)uVar2,0));
      uVar3 = local_208[uVar11];
      printf("%9d ",(ulong)uVar3);
      printf("%6.2f %%",SUB84(((double)(int)uVar3 * 100.0) / (double)(int)uVar2,0));
      putchar(10);
      uVar8 = (ulong)p->nVars;
      bVar5 = (long)uVar11 <= (long)uVar8;
      uVar11 = uVar11 + 1;
    } while (bVar5);
  }
  return;
}

Assistant:

void If_DsdManPrintDistrib( If_DsdMan_t * p )
{
    If_DsdObj_t * pObj; int i;
    int CountObj[IF_MAX_FUNC_LUTSIZE+2] = {0};
    int CountObjNon[IF_MAX_FUNC_LUTSIZE+2] = {0};
    int CountObjNpn[IF_MAX_FUNC_LUTSIZE+2] = {0};
    int CountStr[IF_MAX_FUNC_LUTSIZE+2] = {0};
    int CountStrNon[IF_MAX_FUNC_LUTSIZE+2] = {0};
    int CountMarked[IF_MAX_FUNC_LUTSIZE+2] = {0};
    for ( i = 3; i <= p->nVars; i++ )
    {
        CountObjNpn[i] = Vec_MemEntryNum(p->vTtMem[i]);
        CountObjNpn[p->nVars+1] += Vec_MemEntryNum(p->vTtMem[i]);
    }
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
    {
        CountObj[If_DsdObjFaninNum(pObj)]++,        CountObj[p->nVars+1]++;
        if ( If_DsdObjType(pObj) == IF_DSD_PRIME )
            CountObjNon[If_DsdObjFaninNum(pObj)]++, CountObjNon[p->nVars+1]++;
        CountStr[If_DsdObjSuppSize(pObj)]++,        CountStr[p->nVars+1]++;
        if ( If_DsdManCheckNonDec_rec(p, i) )
            CountStrNon[If_DsdObjSuppSize(pObj)]++, CountStrNon[p->nVars+1]++;
        if ( If_DsdVecObjMark(&p->vObjs, i) )
            CountMarked[If_DsdObjSuppSize(pObj)]++, CountMarked[p->nVars+1]++;
    }
    printf( "***** DSD MANAGER STATISTICS *****\n" );
    printf( "Support     " );
    printf( "Obj   " );
    printf( "ObjNDSD            " );
    printf( "NPNNDSD                  " );
    printf( "Str   " );
    printf( "StrNDSD             " );
    printf( "Marked  " );
    printf( "\n" );
    for ( i = 0; i <= p->nVars + 1; i++ )
    {
        if ( i == p->nVars + 1 )
            printf( "All : " );
        else
            printf( "%3d : ", i );
        printf( "%9d ", CountObj[i] );
        printf( "%9d ", CountObjNon[i] );
        printf( "%6.2f %% ", 100.0 * CountObjNon[i] / Abc_MaxInt(1, CountObj[i]) );
        printf( "%9d ", CountObjNpn[i] );
        printf( "%6.2f %% ", 100.0 * CountObjNpn[i] / Abc_MaxInt(1, CountObj[i]) );
        printf( "  " );
        printf( "%9d ", CountStr[i] );
        printf( "%9d ", CountStrNon[i] );
        printf( "%6.2f %% ", 100.0 * CountStrNon[i] / Abc_MaxInt(1, CountStr[i]) );
        printf( "%9d ", CountMarked[i] );
        printf( "%6.2f %%",  100.0 * CountMarked[i] / Abc_MaxInt(1, CountStr[i]) );
        printf( "\n" );
    }
}